

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelRead.cpp
# Opt level: O1

expected<idx2::chunk_cache,_idx2::idx2_err_code> *
idx2::ParallelReadChunk
          (expected<idx2::chunk_cache,_idx2::idx2_err_code> *__return_storage_ptr__,idx2_file *Idx2,
          decode_data *D,u64 Brick,i8 Level,i8 Subband,i16 BpKey)

{
  atomic<unsigned_long> *paVar1;
  char *pcVar2;
  decode_data *pdVar3;
  undefined8 ChunkCache_00;
  bool bVar4;
  int iVar5;
  __off_t _Var6;
  __off_t _Var7;
  ulong uVar8;
  ulong uVar9;
  FILE *pFVar10;
  long lVar11;
  name_map *pnVar12;
  idx2_err_code iVar13;
  char cVar14;
  byte bVar15;
  unsigned_long *Key;
  uint uVar16;
  uint uVar17;
  undefined7 in_register_00000081;
  ulong uVar18;
  chunk_cache *Val;
  undefined7 in_register_00000089;
  str pcVar19;
  expected<idx2::chunk_cache,_idx2::idx2_err_code> *peVar20;
  ulong *puVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar25;
  int ChunkSizesSz;
  int ChunkAddrsSz;
  int NChunks;
  timer IOTimer;
  file_id FileId;
  iterator FileCacheIt;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:78:3)>
  __ScopeGuard__78;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:71:3)>
  __ScopeGuard__71;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:67:3)>
  __ScopeGuard__67;
  u64 ChunkAddress;
  u64 ChunkAddr;
  int S;
  unique_lock<std::mutex> Lock;
  file_cache FileCache;
  timer IOTimer_1;
  chunk_cache ChunkCache;
  int local_2f4;
  int local_2f0;
  uint local_2ec;
  expected<idx2::chunk_cache,_idx2::idx2_err_code> *local_2e8;
  FILE *local_2e0;
  decode_data *local_2d8;
  undefined4 local_2d0;
  uint local_2cc;
  idx2_file *local_2c8;
  timespec local_2c0;
  anon_union_8_2_2df48d06_for_stref_0 local_2b0 [2];
  undefined1 local_2a0 [16];
  bucket_status *local_290;
  long local_288;
  long local_280;
  buffer *local_278;
  char local_270;
  buffer *local_268;
  char local_260;
  buffer *local_258;
  char local_250;
  undefined1 local_248 [44];
  int local_21c;
  buffer local_218;
  unique_lock<std::mutex> local_1f8;
  buffer local_1e8;
  undefined1 local_1c8 [48];
  hash_table<unsigned_long,_idx2::chunk_cache> local_198 [3];
  iterator local_f0;
  chunk_cache local_d0;
  
  local_1f8._M_device = &D->FileCacheMutex;
  local_1f8._M_owns = false;
  local_2e8 = __return_storage_ptr__;
  std::unique_lock<std::mutex>::lock(&local_1f8);
  local_1f8._M_owns = true;
  local_2cc = (uint)CONCAT71(in_register_00000081,Level);
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_2d0 = (undefined4)CONCAT71(in_register_00000089,Subband);
  local_2c8 = Idx2;
  local_248._24_8_ = Brick;
  ConstructFilePath((file_id *)local_2b0,Idx2,Brick,(i8)Key,Subband,BpKey);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)(local_2a0 + 8),(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)local_2a0,Key);
  clock_gettime(1,&local_2c0);
  local_2d8 = D;
  if ((*(char *)(*(long *)(local_288 + 0x10) + local_280) == '\x02') &&
     (local_290[0xc9] == Tombstone)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x33;
    cVar14 = '\0';
    peVar20 = local_2e8;
  }
  else {
    pFVar10 = fopen(local_2b0[0].Ptr,"rb");
    if (pFVar10 == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x36;
      pnVar12 = &idx2_err_code_s::NameMap;
      iVar13 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != FileNotFound) {
        lVar11 = 0x28;
        do {
          if (lVar11 == 0x3b8) {
            iVar13 = __Invalid__;
            goto LAB_00196079;
          }
          pcVar2 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar11);
          lVar11 = lVar11 + 0x18;
        } while (*pcVar2 != '%');
        iVar13 = FileNotFound;
      }
LAB_00196079:
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar13) {
        lVar11 = 0;
        do {
          lVar24 = lVar11;
          if (lVar24 == 0x390) goto LAB_0019660e;
          lVar11 = lVar24 + 0x18;
        } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar24] != iVar13);
        pnVar12 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar24);
      }
      lVar11 = *in_FS_OFFSET;
      iVar5 = snprintf((char *)(lVar11 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)pnVar12->Arr[0].Name.Size,pnVar12->Arr[0].Name.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                       ,0x36);
      snprintf((char *)(lVar11 + -0xf80) + iVar5,0x400 - (long)iVar5,"File: %s",local_2b0[0].Ptr);
      cVar14 = '%';
      peVar20 = local_2e8;
    }
    else {
      fseeko(pFVar10,0,2);
      _Var6 = ftello(pFVar10);
      local_21c = 0;
      _Var7 = ftello(pFVar10);
      fseeko(pFVar10,_Var7 + -4,0);
      fread(&local_21c,4,1,pFVar10);
      fseeko(pFVar10,_Var7 + -4,0);
      fseeko(pFVar10,_Var6 - local_21c,0);
      local_2ec = 0;
      _Var6 = ftello(pFVar10);
      fseeko(pFVar10,_Var6 + -4,0);
      fread(&local_2ec,4,1,pFVar10);
      fseeko(pFVar10,_Var6 + -4,0);
      _Var6 = ftello(pFVar10);
      fseeko(pFVar10,_Var6 + -4,0);
      fread(&local_2f0,4,1,pFVar10);
      fseeko(pFVar10,_Var6 + -4,0);
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunk();
      }
      local_258 = (buffer *)local_248;
      local_248._0_8_ = (unsigned_long *)0x0;
      local_248._8_8_ = (chunk_cache *)0x0;
      local_248._16_8_ = &Mallocator()::Instance;
      local_250 = '\0';
      lVar11 = (long)local_2f0;
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunk();
      }
      local_2e0 = pFVar10;
      AllocBuf((buffer *)local_248,lVar11,(allocator *)&Mallocator()::Instance);
      sVar22 = (size_t)local_2f0;
      if ((long)local_248._8_8_ < (long)sVar22) {
LAB_00196630:
        __assert_fail("Sz <= Size(*Buf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                      ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
      }
      _Var6 = ftello(pFVar10);
      fseeko(pFVar10,_Var6 - sVar22,0);
      fread((void *)local_248._0_8_,sVar22,1,pFVar10);
      fseeko(pFVar10,_Var6 - sVar22,0);
      pdVar3 = local_2d8;
      LOCK();
      (local_2d8->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (local_2d8->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar22;
      UNLOCK();
      clock_gettime(1,(timespec *)local_1c8);
      LOCK();
      (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)(local_1c8._0_8_ - local_2c0.tv_sec) * 1000000000.0 +
                 (double)(local_1c8._8_8_ - local_2c0.tv_nsec));
      UNLOCK();
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunk();
      }
      local_268 = &local_1e8;
      local_1e8.Data = (byte *)0x0;
      local_1e8.Bytes = 0;
      local_1e8.Alloc = (allocator *)&Mallocator()::Instance;
      local_260 = '\0';
      lVar11 = (long)(int)local_2ec;
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunk();
      }
      AllocBuf(&local_1e8,lVar11 << 3,(allocator *)&Mallocator()::Instance);
      DecompressBufZstd((buffer *)local_248,&local_1e8);
      clock_gettime(1,(timespec *)local_1c8);
      clock_gettime(1,&local_2c0);
      local_2f4 = 0;
      _Var6 = ftello(pFVar10);
      fseeko(pFVar10,_Var6 + -4,0);
      fread(&local_2f4,4,1,pFVar10);
      fseeko(pFVar10,_Var6 + -4,0);
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunk();
      }
      local_278 = &local_218;
      local_218.Data = (byte *)0x0;
      local_218.Bytes = 0;
      local_218.Alloc = (allocator *)&Mallocator()::Instance;
      local_270 = '\0';
      lVar11 = (long)local_2f4;
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunk();
      }
      AllocBuf(&local_218,lVar11,(allocator *)&Mallocator()::Instance);
      pdVar3 = local_2d8;
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunk();
      }
      sVar22 = (size_t)local_2f4;
      if (local_218.Bytes < (long)sVar22) goto LAB_00196630;
      _Var6 = ftello(pFVar10);
      fseeko(pFVar10,_Var6 - sVar22,0);
      fread(local_218.Data,sVar22,1,pFVar10);
      fseeko(pFVar10,_Var6 - sVar22,0);
      LOCK();
      paVar1 = &pdVar3->BytesData_;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + sVar22;
      UNLOCK();
      clock_gettime(1,(timespec *)local_1c8);
      puVar21 = (ulong *)local_218.Data;
      LOCK();
      paVar1 = &pdVar3->DecodeIOTime_;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (long)((double)(local_1c8._0_8_ - local_2c0.tv_sec) * 1000000000.0 +
                 (double)(local_1c8._8_8_ - local_2c0.tv_nsec));
      UNLOCK();
      uVar9 = *(ulong *)local_218.Data;
      file_cache::file_cache((file_cache *)local_1c8);
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunk();
      }
      Init<unsigned_long,idx2::chunk_cache>
                ((hash_table<unsigned_long,_idx2::chunk_cache> *)(local_1c8 + 0x30),10,
                 (allocator *)&Mallocator()::Instance);
      uVar8 = (ulong)local_2ec;
      if (uVar8 != 0) {
        uVar23 = 0;
        pcVar19 = (str)0x0;
        uVar18 = 0;
        do {
          bVar15 = 0;
          lVar11 = 0;
          do {
            uVar17 = (uint)uVar18;
            if (0x39 < (int)uVar17) {
              uVar9 = *(ulong *)((long)puVar21 + (uVar18 >> 3));
              puVar21 = (ulong *)((long)puVar21 + (uVar18 >> 3));
              uVar17 = uVar17 & 7;
            }
            uVar18 = uVar9 >> ((byte)uVar17 & 0x3f);
            uVar16 = uVar17 + 7;
            if (0x38 < (int)uVar17) {
              uVar9 = *(ulong *)((long)puVar21 + (ulong)(uVar16 >> 3));
              puVar21 = (ulong *)((long)puVar21 + (ulong)(uVar16 >> 3));
              uVar16 = uVar16 & 7;
            }
            lVar11 = lVar11 + ((uVar18 & bitstream::Masks.Arr[7]) << (bVar15 & 0x3f));
            Val = (chunk_cache *)(uVar9 >> ((byte)uVar16 & 0x3f));
            uVar18 = (ulong)(uVar16 + 1);
            bVar15 = bVar15 + 7;
          } while (((ulong)Val & bitstream::Masks.Arr[1]) != 0);
          local_248._32_8_ = *(undefined8 *)(local_1e8.Data + uVar23 * 8);
          chunk_cache::chunk_cache(&local_d0);
          local_d0.ChunkPos = (i32)uVar23;
          Insert<unsigned_long,idx2::chunk_cache>
                    (&local_f0,(idx2 *)(local_1c8 + 0x30),
                     (hash_table<unsigned_long,_idx2::chunk_cache> *)(local_248 + 0x20),
                     (unsigned_long *)&local_d0,Val);
          if ((long)local_1c8._32_8_ <= (long)local_1c8._24_8_) {
            GrowCapacity<long>((array<long> *)local_1c8,0);
          }
          pcVar19 = pcVar19 + lVar11;
          lVar11 = local_1c8._24_8_ + 1;
          ((anon_union_8_2_2df48d06_for_stref_0 *)local_1c8._0_8_)[local_1c8._24_8_].Ptr = pcVar19;
          uVar23 = uVar23 + 1;
          local_1c8._24_8_ = lVar11;
        } while (uVar23 != uVar8);
      }
      pFVar10 = local_2e0;
      if (*(char *)(*(long *)(local_288 + 0x10) + local_280) == '\x02') {
        *(bucket_status **)(local_290 + 0x40) = local_198[0].Stats;
        *(i64 *)(local_290 + 0x48) = local_198[0].Size;
        *(i64 *)(local_290 + 0x50) = local_198[0].LogCapacity;
        *(allocator **)(local_290 + 0x58) = local_198[0].Alloc;
        *(unsigned_long **)(local_290 + 0x30) = local_198[0].Keys;
        *(chunk_cache **)(local_290 + 0x38) = local_198[0].Vals;
        *(bucket_status **)(local_290 + 0x40) = local_198[0].Stats;
        *(i64 *)(local_290 + 0x48) = local_198[0].Size;
        *(undefined8 *)local_290 = local_1c8._0_8_;
        *(undefined8 *)(local_290 + 8) = local_1c8._8_8_;
        *(undefined8 *)(local_290 + 0x10) = local_1c8._16_8_;
        *(undefined8 *)(local_290 + 0x18) = local_1c8._24_8_;
        *(undefined8 *)(local_290 + 0x10) = local_1c8._16_8_;
        *(undefined8 *)(local_290 + 0x18) = local_1c8._24_8_;
        *(undefined8 *)(local_290 + 0x20) = local_1c8._32_8_;
        *(ulong *)(local_290 + 0x28) = CONCAT44(local_1c8._44_4_,local_1c8._40_4_);
      }
      else {
        Insert<unsigned_long,idx2::file_cache>
                  ((iterator *)(local_2a0 + 8),(unsigned_long *)local_2a0,(file_cache *)local_1c8);
      }
      peVar20 = local_2e8;
      local_290[0xc9] = Tombstone;
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x71;
      if (local_270 == '\0') {
        DeallocBuf(local_278);
      }
      if (local_260 == '\0') {
        DeallocBuf(local_268);
      }
      if (local_250 == '\0') {
        DeallocBuf(local_258);
      }
      cVar14 = '\0';
    }
    if (pFVar10 != (FILE *)0x0) {
      fclose(pFVar10);
    }
  }
  if ((cVar14 == '\0') && (*(char *)(*(long *)(local_288 + 0x10) + local_280) == '\x02')) {
    cVar14 = (char)local_2cc;
    if ('\x0f' < cVar14) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]")
      ;
    }
    uVar9 = (ulong)(local_2c8->BricksPerChunk).Arr[cVar14];
    lVar11 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    bVar15 = -(uVar9 == 0) | (byte)lVar11;
    local_248._0_8_ =
         ((ulong)((ushort)BpKey & 0xfff) |
         (long)((int)(char)local_2d0 << 0xc) + ((ulong)(local_2cc & 0xff) << 0x3c)) +
         ((ulong)local_248._24_8_ >> ((1L << (bVar15 & 0x3f) != uVar9) + bVar15 & 0x3f)) * 0x40000;
    Lookup<unsigned_long,idx2::chunk_cache>
              ((iterator *)local_1c8,(idx2 *)(local_290 + 0x30),
               (hash_table<unsigned_long,_idx2::chunk_cache> *)local_248,
               (unsigned_long *)local_248._0_8_);
    ChunkCache_00 = local_1c8._8_8_;
    if ((*(bucket_status **)(local_1c8._16_8_ + 0x10))[local_1c8._24_8_] == Occupied) {
      if ((((bitstream *)(local_1c8._8_8_ + 0x68))->Stream).Bytes == 0) {
        clock_gettime(1,(timespec *)&local_f0);
        pFVar10 = fopen(local_2b0[0].Ptr,"rb");
        if (pFVar10 == (FILE *)0x0) {
          local_1c8._0_8_ = local_2b0;
          eVar25 = ParallelReadChunk::anon_class_8_1_1e916d15::operator()
                             ((anon_class_8_1_1e916d15 *)local_1c8);
          peVar20->_vptr_expected = (_func_int **)&PTR__expected_001d0b00;
          (peVar20->field_1).Err.Msg = eVar25.Msg;
          *(short *)((long)&peVar20->field_1 + 8) = eVar25._8_2_;
          (peVar20->field_1).Err.StrGened = eVar25.StrGened;
          peVar20->Ok = false;
        }
        else {
          lVar11 = (long)*(i32 *)ChunkCache_00;
          if (lVar11 < 1) {
            lVar24 = 0;
          }
          else {
            lVar24 = *(long *)((*(undefined8 *)local_290 - 8) + lVar11 * 8);
          }
          lVar11 = *(long *)(*(undefined8 *)local_290 + lVar11 * 8);
          fseeko(pFVar10,lVar24,0);
          if (Mallocator()::Instance == '\0') {
            ParallelReadChunk();
          }
          local_1c8._0_8_ = (anon_union_8_2_2df48d06_for_stref_0 *)0x0;
          local_1c8._8_8_ = (chunk_cache *)0x0;
          local_1c8._16_8_ = &Mallocator()::Instance;
          local_1c8._24_8_ = (byte *)0x0;
          local_1c8._32_8_ = 0;
          local_1c8._40_4_ = 0;
          if (Mallocator()::Instance == '\0') {
            ParallelReadChunk();
          }
          (*(code *)*Mallocator()::Instance)
                    (&Mallocator()::Instance,local_1c8,(lVar11 - lVar24) + 8);
          local_1c8._24_8_ = local_1c8._0_8_;
          local_1c8._40_4_ = 0;
          local_1c8._32_8_ = Empty;
          fread((void *)local_1c8._0_8_,local_1c8._8_8_,1,pFVar10);
          pdVar3 = local_2d8;
          LOCK();
          (local_2d8->BytesData_).super___atomic_base<unsigned_long>._M_i =
               (long)(i32 *)local_1c8._8_8_ +
               (local_2d8->BytesData_).super___atomic_base<unsigned_long>._M_i;
          UNLOCK();
          clock_gettime(1,(timespec *)&local_d0);
          LOCK();
          (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
               (pdVar3->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
               (long)((double)(CONCAT44(local_d0._4_4_,local_d0.ChunkPos) - (long)local_f0.Key) *
                      1000000000.0 +
                     (double)((long)local_d0.Bricks.Buffer.Data - (long)local_f0.Val));
          UNLOCK();
          uVar9 = (ulong)(local_2c8->BricksPerChunk).Arr[cVar14];
          lVar11 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
            }
          }
          bVar15 = -(uVar9 == 0) | (byte)lVar11;
          DecompressChunk((bitstream *)local_1c8,(chunk_cache *)ChunkCache_00,local_248._0_8_,
                          (int)(char)((1L << (bVar15 & 0x3f) != uVar9) + bVar15));
        }
        if (pFVar10 == (FILE *)0x0) goto LAB_0019638d;
        fclose(pFVar10);
      }
      peVar20->_vptr_expected = (_func_int **)&PTR__expected_001d0b00;
      memcpy(&peVar20->field_1,(void *)ChunkCache_00,0xa0);
      bVar4 = true;
    }
    else {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x9d;
      peVar20->_vptr_expected = (_func_int **)&PTR__expected_001d0b00;
      (peVar20->field_1).Err.Msg = "";
      (peVar20->field_1).Err.StrGened = false;
      *(undefined2 *)((long)&peVar20->field_1 + 8) = 0x23;
      bVar4 = false;
    }
    peVar20->Ok = bVar4;
  }
  else {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x94;
    pnVar12 = &idx2_err_code_s::NameMap;
    iVar13 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != FileNotFound) {
      lVar11 = 0x28;
      do {
        if (lVar11 == 0x3b8) {
          iVar13 = __Invalid__;
          goto LAB_001962c5;
        }
        pcVar2 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar11);
        lVar11 = lVar11 + 0x18;
      } while (*pcVar2 != '%');
      iVar13 = FileNotFound;
    }
LAB_001962c5:
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar13) {
      lVar11 = 0;
      do {
        lVar24 = lVar11;
        if (lVar24 == 0x390) {
LAB_0019660e:
          __assert_fail("It != End(EnumS.NameMap)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.h"
                        ,0x38,"stref idx2::ToString(idx2_err_code)");
        }
        lVar11 = lVar24 + 0x18;
      } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar24] != iVar13);
      pnVar12 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar24);
    }
    lVar11 = *in_FS_OFFSET;
    iVar5 = snprintf((char *)(lVar11 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                     (ulong)(uint)pnVar12->Arr[0].Name.Size,pnVar12->Arr[0].Name.field_0.Ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                     ,0x94);
    snprintf((char *)(lVar11 + -0xf80) + iVar5,0x400 - (long)iVar5,"File: %s\n",local_2b0[0].Ptr);
    peVar20->_vptr_expected = (_func_int **)&PTR__expected_001d0b00;
    (peVar20->field_1).Err.Msg = "File: %s\n";
    (peVar20->field_1).Err.StrGened = true;
    *(undefined2 *)((long)&peVar20->field_1 + 8) = 0x25;
    peVar20->Ok = false;
  }
LAB_0019638d:
  std::unique_lock<std::mutex>::~unique_lock(&local_1f8);
  return peVar20;
}

Assistant:

expected<chunk_cache, idx2_err_code>
ParallelReadChunk(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
    auto ChunkCacheIt = Lookup(D->FileCache.ChunkCaches, ChunkAddress);
    if (ChunkCacheIt)
      return *ChunkCacheIt.Val;

    bitstream ChunkStream;
    bool Result = Idx2.external_read(Idx2, ChunkStream.Stream, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    // decompress part
    chunk_cache ChunkCache;
    DecompressChunk(&ChunkStream, &ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
    Insert(&ChunkCacheIt, ChunkAddress, ChunkCache);
    return *ChunkCacheIt.Val;
  }
#endif

  std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, BpKey);
  // TODO: lock and be careful about invalidated pointer
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  auto Result = ParallelReadFile(Idx2, D, &FileCacheIt, FileId);
  if (!Result || !FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
  const file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkCaches)::iterator ChunkCacheIt;
  // TODO: lock and be careful about invalidated pointer
  ChunkCacheIt = Lookup(FileCache->ChunkCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);
  chunk_cache* ChunkCache = ChunkCacheIt.Val;
  if (Size(ChunkCache->ChunkStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkCache->ChunkPos;
    i64 ChunkOffset = ChunkPos > 0 ? FileCache->ChunkOffsets[ChunkPos - 1] : 0;
    i64 ChunkSize = FileCache->ChunkOffsets[ChunkPos] - ChunkOffset;
    idx2_FSeek(Fp, ChunkOffset, SEEK_SET);
    bitstream ChunkStream;
    // NOTE: not a memory leak since we will keep track of this in ChunkCache
    InitWrite(&ChunkStream, ChunkSize);
    ReadBuffer(Fp, &ChunkStream.Stream);
    D->BytesData_ += Size(ChunkStream.Stream);
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    // TODO: check for error
    DecompressChunk(&ChunkStream, ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
  }

  return *ChunkCache;
}